

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O2

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary_edge_chunk
          (_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *param_3,bool _swap)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  BaseProperty *_bp;
  size_t sVar3;
  ulong uVar4;
  
  if (((uint)this->chunk_header_ & 0x1c) == 0x10) {
    uVar1 = this->bytes_;
    if (((uint)this->chunk_header_ & 0x1e0) == 0xc0) {
      iVar2 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
      _bp = PropertyContainer::property
                      ((PropertyContainer *)(CONCAT44(extraout_var,iVar2) + 0x48),
                       &(this->property_name_).super_string);
      sVar3 = restore_binary_custom_data(this,_is,_bp,(ulong)(this->header_).n_edges_,_swap);
    }
    else {
      sVar3 = OMFormat::chunk_data_size(&this->header_,&this->chunk_header_);
      std::istream::ignore((long)_is);
    }
    uVar4 = sVar3 + this->bytes_;
    this->bytes_ = uVar4;
    return uVar1 < uVar4;
  }
  __assert_fail("chunk_header_.entity_ == Chunk::Entity_Edge",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                ,0x1c1,
                "bool OpenMesh::IO::_OMReader_::read_binary_edge_chunk(std::istream &, BaseImporter &, Options &, bool) const"
               );
}

Assistant:

bool _OMReader_::read_binary_edge_chunk(std::istream &_is, BaseImporter &_bi, Options &/*_opt */, bool _swap) const
{
  using OMFormat::Chunk;

  assert( chunk_header_.entity_ == Chunk::Entity_Edge);

  size_t b = bytes_;

  switch (chunk_header_.type_) {
    case Chunk::Type_Custom:

      bytes_ += restore_binary_custom_data(_is, _bi.kernel()->_get_eprop(property_name_), header_.n_edges_, _swap);

      break;

    default:
      // skip unknown type
      size_t size_of = OMFormat::chunk_data_size(header_, chunk_header_);
      _is.ignore(size_of);
      bytes_ += size_of;
  }

  return b < bytes_;
}